

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void update_fcr31(CPUMIPSState_conflict10 *env,uintptr_t pc)

{
  int xcpt;
  uint uVar1;
  int tmp;
  uintptr_t pc_local;
  CPUMIPSState_conflict10 *env_local;
  
  xcpt = get_float_exception_flags(&(env->active_fpu).fp_status);
  uVar1 = ieee_ex_to_mips_mips64el(xcpt);
  (env->active_fpu).fcr31 = (env->active_fpu).fcr31 & 0xfffc0fff | (uVar1 & 0x3f) << 0xc;
  if (uVar1 != 0) {
    set_float_exception_flags(0,&(env->active_fpu).fp_status);
    if (((env->active_fpu).fcr31 >> 7 & 0x1f & uVar1) != 0) {
      do_raise_exception(env,0x17,pc);
    }
    (env->active_fpu).fcr31 = (uVar1 & 0x1f) << 2 | (env->active_fpu).fcr31;
  }
  return;
}

Assistant:

static inline void update_fcr31(CPUMIPSState *env, uintptr_t pc)
{
    int tmp = ieee_ex_to_mips(get_float_exception_flags(
                                  &env->active_fpu.fp_status));

    SET_FP_CAUSE(env->active_fpu.fcr31, tmp);

    if (tmp) {
        set_float_exception_flags(0, &env->active_fpu.fp_status);

        if (GET_FP_ENABLE(env->active_fpu.fcr31) & tmp) {
            do_raise_exception(env, EXCP_FPE, pc);
        } else {
            UPDATE_FP_FLAGS(env->active_fpu.fcr31, tmp);
        }
    }
}